

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  UnknownFieldSet *pUVar1;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  uint32 value_00;
  int iVar5;
  int iVar6;
  uint64 uVar7;
  int64 iVar8;
  EnumDescriptor *pEVar9;
  FileDescriptor *this_00;
  DescriptorPool *pDVar10;
  DescriptorPool *pDVar11;
  string *psVar12;
  EnumDescriptor *pEVar13;
  string *psVar14;
  double dVar15;
  undefined1 auVar16 [16];
  Symbol SVar17;
  float local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  int local_49c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  undefined1 local_3d8 [8];
  Symbol symbol;
  string fully_qualified_name;
  EnumValueDescriptor *enum_value;
  string *value_name;
  EnumDescriptor *enum_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  uint64 local_2d0;
  uint64 value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  double local_288;
  double value_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  float local_23c;
  undefined1 local_238 [4];
  float value_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  UnknownFieldSet *local_28;
  UnknownFieldSet *unknown_fields_local;
  FieldDescriptor *option_field_local;
  OptionInterpreter *this_local;
  
  local_28 = unknown_fields;
  unknown_fields_local = (UnknownFieldSet *)option_field;
  option_field_local = (FieldDescriptor *)this;
  CVar3 = FieldDescriptor::cpp_type(option_field);
  switch(CVar3) {
  case CPPTYPE_INT32:
    bVar2 = UninterpretedOption::has_positive_int_value(this->uninterpreted_option_);
    if (bVar2) {
      uVar7 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
      if (0x7fffffff < uVar7) {
        psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
        std::operator+(&local_68,"Value out of range for int32 option \"",psVar14);
        std::operator+(&local_48,&local_68,"\".");
        this_local._7_1_ = AddValueError(this,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        goto LAB_00a8fb09;
      }
      iVar6 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
      uVar7 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
      TVar4 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
      SetInt32(this,iVar6,(int32)uVar7,TVar4,local_28);
    }
    else {
      bVar2 = UninterpretedOption::has_negative_int_value(this->uninterpreted_option_);
      if (!bVar2) {
        psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
        std::operator+(&local_f8,"Value must be integer for int32 option \"",psVar14);
        std::operator+(&local_d8,&local_f8,"\".");
        this_local._7_1_ = AddValueError(this,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        goto LAB_00a8fb09;
      }
      iVar8 = UninterpretedOption::negative_int_value(this->uninterpreted_option_);
      if (iVar8 < -0x80000000) {
        psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
        std::operator+(&local_b8,"Value out of range for int32 option \"",psVar14);
        std::operator+(&local_98,&local_b8,"\".");
        this_local._7_1_ = AddValueError(this,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_b8);
        goto LAB_00a8fb09;
      }
      iVar6 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
      iVar8 = UninterpretedOption::negative_int_value(this->uninterpreted_option_);
      TVar4 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
      SetInt32(this,iVar6,(int32)iVar8,TVar4,local_28);
    }
    break;
  case CPPTYPE_INT64:
    bVar2 = UninterpretedOption::has_positive_int_value(this->uninterpreted_option_);
    if (bVar2) {
      uVar7 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
      if (0x7fffffffffffffff < uVar7) {
        psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
        std::operator+(&local_138,"Value out of range for int64 option \"",psVar14);
        std::operator+(&local_118,&local_138,"\".");
        this_local._7_1_ = AddValueError(this,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        goto LAB_00a8fb09;
      }
      iVar6 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
      uVar7 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
      TVar4 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
      SetInt64(this,iVar6,uVar7,TVar4,local_28);
    }
    else {
      bVar2 = UninterpretedOption::has_negative_int_value(this->uninterpreted_option_);
      if (!bVar2) {
        psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
        std::operator+(&local_178,"Value must be integer for int64 option \"",psVar14);
        std::operator+(&local_158,&local_178,"\".");
        this_local._7_1_ = AddValueError(this,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        goto LAB_00a8fb09;
      }
      iVar6 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
      iVar8 = UninterpretedOption::negative_int_value(this->uninterpreted_option_);
      TVar4 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
      SetInt64(this,iVar6,iVar8,TVar4,local_28);
    }
    break;
  case CPPTYPE_UINT32:
    bVar2 = UninterpretedOption::has_positive_int_value(this->uninterpreted_option_);
    if (!bVar2) {
      psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
      std::operator+(&local_1f8,"Value must be non-negative integer for uint32 option \"",psVar14);
      std::operator+(&local_1d8,&local_1f8,"\".");
      this_local._7_1_ = AddValueError(this,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      goto LAB_00a8fb09;
    }
    uVar7 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
    if (0xffffffff < uVar7) {
      psVar14 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
      std::operator+(&local_1b8,"Value out of range for uint32 option \"",psVar14);
      std::operator+(&local_198,&local_1b8,"\".");
      this_local._7_1_ = AddValueError(this,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      goto LAB_00a8fb09;
    }
    iVar6 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    uVar7 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
    TVar4 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
    SetUInt32(this,iVar6,(uint32)uVar7,TVar4,local_28);
    break;
  case CPPTYPE_UINT64:
    bVar2 = UninterpretedOption::has_positive_int_value(this->uninterpreted_option_);
    if (!bVar2) {
      psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                     "Value must be non-negative integer for uint64 option \"",psVar14);
      std::operator+(&local_218,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                     "\".");
      this_local._7_1_ = AddValueError(this,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)local_238);
      goto LAB_00a8fb09;
    }
    iVar6 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    uVar7 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
    TVar4 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
    SetUInt64(this,iVar6,uVar7,TVar4,local_28);
    break;
  case CPPTYPE_DOUBLE:
    bVar2 = UninterpretedOption::has_double_value(this->uninterpreted_option_);
    if (bVar2) {
      local_288 = UninterpretedOption::double_value(this->uninterpreted_option_);
    }
    else {
      bVar2 = UninterpretedOption::has_positive_int_value(this->uninterpreted_option_);
      if (bVar2) {
        uVar7 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
        auVar16._8_4_ = (int)(uVar7 >> 0x20);
        auVar16._0_8_ = uVar7;
        auVar16._12_4_ = 0x45300000;
        local_288 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
      }
      else {
        bVar2 = UninterpretedOption::has_negative_int_value(this->uninterpreted_option_);
        if (!bVar2) {
          psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value
                         ,"Value must be number for double option \"",psVar14);
          std::operator+(&local_2a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value
                         ,"\".");
          this_local._7_1_ = AddValueError(this,&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&value);
          goto LAB_00a8fb09;
        }
        iVar8 = UninterpretedOption::negative_int_value(this->uninterpreted_option_);
        local_288 = (double)iVar8;
      }
    }
    pUVar1 = local_28;
    iVar6 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    uVar7 = internal::WireFormatLite::EncodeDouble(local_288);
    UnknownFieldSet::AddFixed64(pUVar1,iVar6,uVar7);
    break;
  case CPPTYPE_FLOAT:
    bVar2 = UninterpretedOption::has_double_value(this->uninterpreted_option_);
    if (bVar2) {
      dVar15 = UninterpretedOption::double_value(this->uninterpreted_option_);
      local_23c = (float)dVar15;
    }
    else {
      bVar2 = UninterpretedOption::has_positive_int_value(this->uninterpreted_option_);
      if (bVar2) {
        uVar7 = UninterpretedOption::positive_int_value(this->uninterpreted_option_);
        local_678 = (float)uVar7;
        local_23c = local_678;
      }
      else {
        bVar2 = UninterpretedOption::has_negative_int_value(this->uninterpreted_option_);
        if (!bVar2) {
          psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &value_2,"Value must be number for float option \"",psVar14);
          std::operator+(&local_260,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &value_2,"\".");
          this_local._7_1_ = AddValueError(this,&local_260);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&value_2);
          goto LAB_00a8fb09;
        }
        iVar8 = UninterpretedOption::negative_int_value(this->uninterpreted_option_);
        local_23c = (float)iVar8;
      }
    }
    pUVar1 = local_28;
    iVar6 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    value_00 = internal::WireFormatLite::EncodeFloat(local_23c);
    UnknownFieldSet::AddFixed32(pUVar1,iVar6,value_00);
    break;
  case CPPTYPE_BOOL:
    bVar2 = UninterpretedOption::has_identifier_value(this->uninterpreted_option_);
    if (!bVar2) {
      psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
      std::operator+(&local_310,"Value must be identifier for boolean option \"",psVar14);
      std::operator+(&local_2f0,&local_310,"\".");
      this_local._7_1_ = AddValueError(this,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      goto LAB_00a8fb09;
    }
    psVar14 = UninterpretedOption::identifier_value_abi_cxx11_(this->uninterpreted_option_);
    bVar2 = std::operator==(psVar14,"true");
    if (bVar2) {
      local_2d0 = 1;
    }
    else {
      psVar14 = UninterpretedOption::identifier_value_abi_cxx11_(this->uninterpreted_option_);
      bVar2 = std::operator==(psVar14,"false");
      if (!bVar2) {
        psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
        std::operator+(&local_350,"Value must be \"true\" or \"false\" for boolean option \"",
                       psVar14);
        std::operator+(&local_330,&local_350,"\".");
        this_local._7_1_ = AddValueError(this,&local_330);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_350);
        goto LAB_00a8fb09;
      }
      local_2d0 = 0;
    }
    pUVar1 = local_28;
    iVar6 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    UnknownFieldSet::AddVarint(pUVar1,iVar6,local_2d0);
    break;
  case CPPTYPE_ENUM:
    bVar2 = UninterpretedOption::has_identifier_value(this->uninterpreted_option_);
    if (!bVar2) {
      psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enum_type
                     ,"Value must be identifier for enum-valued option \"",psVar14);
      std::operator+(&local_370,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enum_type
                     ,"\".");
      this_local._7_1_ = AddValueError(this,&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&enum_type);
      goto LAB_00a8fb09;
    }
    pEVar9 = FieldDescriptor::enum_type((FieldDescriptor *)unknown_fields_local);
    psVar14 = UninterpretedOption::identifier_value_abi_cxx11_(this->uninterpreted_option_);
    fully_qualified_name.field_2._8_8_ = 0;
    this_00 = EnumDescriptor::file(pEVar9);
    pDVar10 = FileDescriptor::pool(this_00);
    pDVar11 = DescriptorPool::generated_pool();
    if (pDVar10 == pDVar11) {
      fully_qualified_name.field_2._8_8_ = EnumDescriptor::FindValueByName(pEVar9,psVar14);
    }
    else {
      psVar12 = EnumDescriptor::full_name_abi_cxx11_(pEVar9);
      std::__cxx11::string::string((string *)&symbol.field_1,(string *)psVar12);
      std::__cxx11::string::size();
      EnumDescriptor::name_abi_cxx11_(pEVar9);
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)&symbol.field_1);
      std::__cxx11::string::operator+=((string *)&symbol.field_1,(string *)psVar14);
      SVar17 = FindSymbolNotEnforcingDeps(this->builder_,(string *)&symbol.field_1,true);
      symbol._0_8_ = SVar17.field_1;
      local_3d8._0_4_ = SVar17.type;
      bVar2 = Symbol::IsNull((Symbol *)local_3d8);
      if ((bVar2) || (local_3d8._0_4_ != ENUM_VALUE)) {
LAB_00a8f74e:
        local_49c = 0;
      }
      else {
        pEVar13 = EnumValueDescriptor::type((EnumValueDescriptor *)symbol._0_8_);
        if (pEVar13 == pEVar9) {
          fully_qualified_name.field_2._8_8_ = symbol._0_8_;
          goto LAB_00a8f74e;
        }
        psVar12 = EnumDescriptor::full_name_abi_cxx11_(pEVar9);
        std::operator+(&local_498,"Enum type \"",psVar12);
        std::operator+(&local_478,&local_498,"\" has no value named \"");
        std::operator+(&local_458,&local_478,psVar14);
        std::operator+(&local_438,&local_458,"\" for option \"");
        psVar12 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
        std::operator+(&local_418,&local_438,psVar12);
        std::operator+(&local_3f8,&local_418,"\". This appears to be a value from a sibling type.");
        this_local._7_1_ = AddValueError(this,&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::~string((string *)&local_498);
        local_49c = 1;
      }
      std::__cxx11::string::~string((string *)&symbol.field_1);
      if (local_49c != 0) goto LAB_00a8fb09;
    }
    pUVar1 = local_28;
    if (fully_qualified_name.field_2._8_8_ == 0) {
      pEVar9 = FieldDescriptor::enum_type((FieldDescriptor *)unknown_fields_local);
      psVar12 = EnumDescriptor::full_name_abi_cxx11_(pEVar9);
      std::operator+(&local_560,"Enum type \"",psVar12);
      std::operator+(&local_540,&local_560,"\" has no value named \"");
      std::operator+(&local_520,&local_540,psVar14);
      std::operator+(&local_500,&local_520,"\" for option \"");
      psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
      std::operator+(&local_4e0,&local_500,psVar14);
      std::operator+(&local_4c0,&local_4e0,"\".");
      this_local._7_1_ = AddValueError(this,&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_560);
      goto LAB_00a8fb09;
    }
    iVar6 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    iVar5 = EnumValueDescriptor::number((EnumValueDescriptor *)fully_qualified_name.field_2._8_8_);
    UnknownFieldSet::AddVarint(pUVar1,iVar6,(long)iVar5);
    break;
  case CPPTYPE_STRING:
    bVar2 = UninterpretedOption::has_string_value(this->uninterpreted_option_);
    pUVar1 = local_28;
    if (!bVar2) {
      psVar14 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
      std::operator+(&local_5a0,"Value must be quoted string for string option \"",psVar14);
      std::operator+(&local_580,&local_5a0,"\".");
      this_local._7_1_ = AddValueError(this,&local_580);
      std::__cxx11::string::~string((string *)&local_580);
      std::__cxx11::string::~string((string *)&local_5a0);
      goto LAB_00a8fb09;
    }
    iVar6 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
    psVar14 = UninterpretedOption::string_value_abi_cxx11_(this->uninterpreted_option_);
    UnknownFieldSet::AddLengthDelimited(pUVar1,iVar6,psVar14);
    break;
  case CPPTYPE_MESSAGE:
    bVar2 = SetAggregateOption(this,(FieldDescriptor *)unknown_fields_local,local_28);
    if (!bVar2) {
      this_local._7_1_ = 0;
      goto LAB_00a8fb09;
    }
  }
  this_local._7_1_ = 1;
LAB_00a8fb09:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetOptionValue(
    const FieldDescriptor* option_field,
    UnknownFieldSet* unknown_fields) {
  // We switch on the CppType to validate.
  switch (option_field->cpp_type()) {

    case FieldDescriptor::CPPTYPE_INT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64>(kint32max)) {
          return AddValueError("Value out of range for int32 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        if (uninterpreted_option_->negative_int_value() <
            static_cast<int64>(kint32min)) {
          return AddValueError("Value out of range for int32 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->negative_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError("Value must be integer for int32 option \"" +
                             option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_INT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64>(kint64max)) {
          return AddValueError("Value out of range for int64 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt64(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        SetInt64(option_field->number(),
                 uninterpreted_option_->negative_int_value(),
                 option_field->type(), unknown_fields);
      } else {
        return AddValueError("Value must be integer for int64 option \"" +
                             option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() > kuint32max) {
          return AddValueError("Value out of range for uint32 option \"" +
                               option_field->name() + "\".");
        } else {
          SetUInt32(option_field->number(),
                    uninterpreted_option_->positive_int_value(),
                    option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError("Value must be non-negative integer for uint32 "
                             "option \"" + option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        SetUInt64(option_field->number(),
                  uninterpreted_option_->positive_int_value(),
                  option_field->type(), unknown_fields);
      } else {
        return AddValueError("Value must be non-negative integer for uint64 "
                             "option \"" + option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else {
        return AddValueError("Value must be number for float option \"" +
                             option_field->full_name() + "\".");
      }
      unknown_fields->AddFixed32(option_field->number(),
          google::protobuf::internal::WireFormatLite::EncodeFloat(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else {
        return AddValueError("Value must be number for double option \"" +
                             option_field->full_name() + "\".");
      }
      unknown_fields->AddFixed64(option_field->number(),
          google::protobuf::internal::WireFormatLite::EncodeDouble(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_BOOL:
      uint64 value;
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError("Value must be identifier for boolean option "
                             "\"" + option_field->full_name() + "\".");
      }
      if (uninterpreted_option_->identifier_value() == "true") {
        value = 1;
      } else if (uninterpreted_option_->identifier_value() == "false") {
        value = 0;
      } else {
        return AddValueError("Value must be \"true\" or \"false\" for boolean "
                             "option \"" + option_field->full_name() + "\".");
      }
      unknown_fields->AddVarint(option_field->number(), value);
      break;

    case FieldDescriptor::CPPTYPE_ENUM: {
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError("Value must be identifier for enum-valued option "
                             "\"" + option_field->full_name() + "\".");
      }
      const EnumDescriptor* enum_type = option_field->enum_type();
      const string& value_name = uninterpreted_option_->identifier_value();
      const EnumValueDescriptor* enum_value = NULL;

      if (enum_type->file()->pool() != DescriptorPool::generated_pool()) {
        // Note that the enum value's fully-qualified name is a sibling of the
        // enum's name, not a child of it.
        string fully_qualified_name = enum_type->full_name();
        fully_qualified_name.resize(fully_qualified_name.size() -
                                    enum_type->name().size());
        fully_qualified_name += value_name;

        // Search for the enum value's descriptor in the builder's pool. Note
        // that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
        // DescriptorPool::FindEnumValueByName() because we're already holding
        // the pool's mutex, and the latter method locks it again.
        Symbol symbol =
          builder_->FindSymbolNotEnforcingDeps(fully_qualified_name);
        if (!symbol.IsNull() && symbol.type == Symbol::ENUM_VALUE) {
          if (symbol.enum_value_descriptor->type() != enum_type) {
            return AddValueError("Enum type \"" + enum_type->full_name() +
                "\" has no value named \"" + value_name + "\" for option \"" +
                option_field->full_name() +
                "\". This appears to be a value from a sibling type.");
          } else {
            enum_value = symbol.enum_value_descriptor;
          }
        }
      } else {
        // The enum type is in the generated pool, so we can search for the
        // value there.
        enum_value = enum_type->FindValueByName(value_name);
      }

      if (enum_value == NULL) {
        return AddValueError("Enum type \"" +
                             option_field->enum_type()->full_name() +
                             "\" has no value named \"" + value_name + "\" for "
                             "option \"" + option_field->full_name() + "\".");
      } else {
        // Sign-extension is not a problem, since we cast directly from int32 to
        // uint64, without first going through uint32.
        unknown_fields->AddVarint(option_field->number(),
          static_cast<uint64>(static_cast<int64>(enum_value->number())));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_STRING:
      if (!uninterpreted_option_->has_string_value()) {
        return AddValueError("Value must be quoted string for string option "
                             "\"" + option_field->full_name() + "\".");
      }
      // The string has already been unquoted and unescaped by the parser.
      unknown_fields->AddLengthDelimited(option_field->number(),
          uninterpreted_option_->string_value());
      break;

    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (!SetAggregateOption(option_field, unknown_fields)) {
        return false;
      }
      break;
  }

  return true;
}